

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O1

RealType __thiscall
OpenMD::EAM::Zhou2001Functional
          (EAM *this,RealType rho,RealType rhoe,vector<double,_std::allocator<double>_> *Fn,
          vector<double,_std::allocator<double>_> *F,RealType Fe,RealType eta)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = rhoe * 0.85;
  if (dVar5 <= rho) {
    if ((rho < dVar5) || (rhoe * 1.15 <= rho)) {
      if (rho < rhoe * 1.15) {
        return 0.0;
      }
      dVar5 = pow(rho / rhoe,eta);
      dVar5 = log(dVar5);
      dVar6 = pow(rho / rhoe,eta);
      return dVar6 * (1.0 - dVar5) * Fe;
    }
    pdVar2 = (F->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (F->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = (long)pdVar1 - (long)pdVar2 >> 3;
    if (pdVar1 == pdVar2) goto LAB_00234730;
    if (uVar3 < 2) goto LAB_0023473b;
    if ((long)pdVar1 - (long)pdVar2 == 0x10) goto LAB_00234749;
    if (3 < uVar3) {
      dVar5 = rho / rhoe;
      goto LAB_002346a6;
    }
  }
  else {
    pdVar2 = (Fn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (Fn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = (long)pdVar1 - (long)pdVar2 >> 3;
    if (pdVar1 == pdVar2) {
LAB_00234730:
      uVar4 = 0;
      goto LAB_00234763;
    }
    if (uVar3 < 2) {
LAB_0023473b:
      uVar4 = 1;
      goto LAB_00234763;
    }
    if ((long)pdVar1 - (long)pdVar2 == 0x10) {
LAB_00234749:
      uVar4 = 2;
      goto LAB_00234763;
    }
    if (3 < uVar3) {
      dVar5 = rho / dVar5;
LAB_002346a6:
      dVar5 = dVar5 + -1.0;
      return ((pdVar2[3] * dVar5 + pdVar2[2]) * dVar5 + pdVar2[1]) * dVar5 + *pdVar2;
    }
  }
  uVar4 = 3;
LAB_00234763:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

RealType EAM::Zhou2001Functional(RealType rho, RealType rhoe,
                                   std::vector<RealType> Fn,
                                   std::vector<RealType> F, RealType Fe,
                                   RealType eta) {
    RealType rhon = 0.85 * rhoe;
    RealType rho0 = 1.15 * rhoe;
    RealType functional(0.0);
    RealType t;
    if (rho < rhon) {
      t          = rho / rhon - 1.0;
      functional = Fn.at(0) + t * (Fn.at(1) + t * (Fn.at(2) + t * Fn.at(3)));
    } else if (rho >= rhon && rho < rho0) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F.at(3)));
    } else if (rho >= rho0) {
      t          = rho / rhoe;
      functional = Fe * (1.0 - log(pow(t, eta))) * pow(t, eta);
    }
    return functional;
  }